

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

size_t bssl::anon_unknown_0::GetClientHelloLen
                 (uint16_t max_version,uint16_t session_version,size_t ticket_len)

{
  _Head_base<0UL,_ssl_session_st_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  SSL_METHOD *pSVar4;
  time_t t;
  size_t sVar5;
  UniquePtr<SSL_SESSION> session;
  vector<unsigned_char,_std::allocator<unsigned_char>_> client_hello;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<SSL_CTX> ssl_ctx;
  _Head_base<0UL,_ssl_session_st_*,_false> local_70;
  allocator_type local_61;
  _Head_base<0UL,_ssl_session_st_*,_false> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_28;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_20;
  
  pSVar4 = (SSL_METHOD *)TLS_method();
  local_28._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar4);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = DecodeBase64(&local_58,(anonymous_namespace)::kOpenSSLSession);
  if (bVar2) {
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_20._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar4);
    if (local_20._M_head_impl == (SSL_CTX *)0x0) {
      local_60._M_head_impl = (ssl_session_st *)0x0;
      bVar2 = false;
    }
    else {
      local_70._M_head_impl._0_1_ = 0x61;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_40,ticket_len,(value_type_conflict3 *)&local_70,&local_61);
      local_70._M_head_impl =
           SSL_SESSION_from_bytes
                     (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,local_20._M_head_impl);
      if ((((SSL_SESSION *)local_70._M_head_impl == (SSL_SESSION *)0x0) ||
          (iVar3 = SSL_SESSION_set_protocol_version(local_70._M_head_impl,session_version),
          iVar3 == 0)) ||
         (iVar3 = SSL_SESSION_set_ticket
                            (local_70._M_head_impl,
                             local_40.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_40.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_40.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start),
         _Var1._M_head_impl = local_70._M_head_impl, iVar3 == 0)) {
        local_60._M_head_impl = (ssl_session_st *)0x0;
        bVar2 = false;
      }
      else {
        t = time((time_t *)0x0);
        SSL_SESSION_set_time((SSL_SESSION *)_Var1._M_head_impl,t);
        _Var1._M_head_impl = local_70._M_head_impl;
        local_60._M_head_impl = local_70._M_head_impl;
        local_70._M_head_impl = (ssl_session_st *)0x0;
        bVar2 = (SSL_SESSION *)_Var1._M_head_impl != (SSL_SESSION *)0x0;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_70);
      if ((SSL *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (SSL *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_20);
  }
  else {
    local_60._M_head_impl = (ssl_session_st *)0x0;
    bVar2 = false;
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((bool)(local_28._M_head_impl != (ssl_ctx_st *)0x0 & bVar2)) {
    local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)SSL_new((SSL_CTX *)local_28._M_head_impl);
    if ((((SSL *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start == (SSL *)0x0) ||
        (iVar3 = SSL_set_session((SSL *)local_40.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                 (SSL_SESSION *)local_60._M_head_impl), iVar3 == 0)) ||
       ((iVar3 = SSL_set_strict_cipher_list
                           ((SSL *)local_40.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                            "ECDHE-RSA-AES128-GCM-SHA256"), iVar3 == 0 ||
        (iVar3 = SSL_set_max_proto_version
                           ((SSL *)local_40.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,max_version),
        iVar3 == 0)))) {
      sVar5 = 0;
    }
    else {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uint8_t *)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = GetClientHello((SSL *)local_40.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,&local_58);
      if (bVar2) {
        sVar5 = 0;
        if (5 < (ulong)((long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_58.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
          sVar5 = ((long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) - 5;
        }
      }
      else {
        sVar5 = 0;
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_40);
  }
  else {
    sVar5 = 0;
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_60);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_28);
  return sVar5;
}

Assistant:

static size_t GetClientHelloLen(uint16_t max_version, uint16_t session_version,
                                size_t ticket_len) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  bssl::UniquePtr<SSL_SESSION> session =
      CreateSessionWithTicket(session_version, ticket_len);
  if (!ctx || !session) {
    return 0;
  }

  // Set a one-element cipher list so the baseline ClientHello is unpadded.
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  if (!ssl || !SSL_set_session(ssl.get(), session.get()) ||
      !SSL_set_strict_cipher_list(ssl.get(), "ECDHE-RSA-AES128-GCM-SHA256") ||
      !SSL_set_max_proto_version(ssl.get(), max_version)) {
    return 0;
  }

  std::vector<uint8_t> client_hello;
  if (!GetClientHello(ssl.get(), &client_hello) ||
      client_hello.size() <= SSL3_RT_HEADER_LENGTH) {
    return 0;
  }

  return client_hello.size() - SSL3_RT_HEADER_LENGTH;
}